

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O1

int grasshopper_omac_acpkm_init(EVP_MD_CTX *ctx)

{
  int iVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)EVP_MD_CTX_get0_md_data();
  puVar2[2] = 0;
  puVar2[3] = 0;
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = "kuznyechik-cbc";
  *(undefined4 *)(puVar2 + 3) = 0;
  iVar1 = OBJ_txt2nid("kuznyechik-cbc");
  if (iVar1 == 0x3f7) {
    puVar2[1] = 0x10;
  }
  return 1;
}

Assistant:

static int omac_acpkm_init(EVP_MD_CTX *ctx, const char *cipher_name)
{
    OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
    memset(c, 0, sizeof(OMAC_ACPKM_CTX));
    c->cipher_name = cipher_name;
    c->key_set = 0;

    switch (OBJ_txt2nid(cipher_name)) {
    case NID_grasshopper_cbc:
        c->dgst_size = 16;
        break;
    }

    return 1;
}